

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  int ret;
  int error_count;
  int success_count;
  uint idx;
  char **argv_local;
  int argc_local;
  
  error_count = 0;
  local_24 = 0;
  while (gl_unit_tests[(uint)error_count].name != (char *)0x0) {
    iVar1 = (*gl_unit_tests[(uint)error_count].fun_unit_test)();
    pcVar2 = "FAIL";
    if (iVar1 == 1) {
      pcVar2 = "PASS";
    }
    printf("[%s] %s\n",pcVar2,gl_unit_tests[(uint)error_count].name);
    if (iVar1 != 1) {
      local_24 = local_24 + 1;
    }
    error_count = error_count + 1;
  }
  return local_24;
}

Assistant:

int main(int argc, char **argv) {
    (void) argc;  // Unused parameter
    (void) argv;  // Unused parameter

    unsigned int idx           = 0;
    int          success_count = 0;
    int          error_count   = 0;

    while (gl_unit_tests[idx].name != NULL) {
        int ret = gl_unit_tests[idx].fun_unit_test();
        printf("[%s] %s\n", ret == 1 ? "PASS" : "FAIL", gl_unit_tests[idx].name);

        if (ret == 1) {
            success_count += 1;
        } else {
            error_count += 1;
        }

        idx += 1;
    }

    return (error_count);
}